

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O3

int64_t get_sse(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  int iVar4;
  long lVar5;
  int j;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint8_t *puVar9;
  int i_1;
  int64_t sse;
  int64_t iVar10;
  uint8_t *puVar11;
  
  iVar1 = width + 0xf;
  if (-1 < width) {
    iVar1 = width;
  }
  uVar7 = width % 0x10;
  iVar2 = height + 0xf;
  if (-1 < height) {
    iVar2 = height;
  }
  iVar8 = height % 0x10;
  iVar4 = 0;
  if ((int)uVar7 < 1 || height < 1) {
    iVar10 = 0;
  }
  else {
    puVar9 = b + (int)(width - uVar7);
    puVar11 = a + (int)(width - uVar7);
    iVar10 = 0;
    do {
      uVar6 = 0;
      do {
        iVar10 = iVar10 + (ulong)(((uint)puVar11[uVar6] - (uint)puVar9[uVar6]) *
                                 ((uint)puVar11[uVar6] - (uint)puVar9[uVar6]));
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
      puVar11 = puVar11 + a_stride;
      puVar9 = puVar9 + b_stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
  }
  if (0 < iVar8) {
    puVar9 = a + (height - iVar8) * a_stride;
    puVar11 = b + (height - iVar8) * b_stride;
    lVar5 = 0;
    iVar4 = 0;
    do {
      if (0 < (int)(width - uVar7)) {
        uVar6 = 0;
        do {
          lVar5 = lVar5 + (ulong)(((uint)puVar9[uVar6] - (uint)puVar11[uVar6]) *
                                 ((uint)puVar9[uVar6] - (uint)puVar11[uVar6]));
          uVar6 = uVar6 + 1;
        } while (width - uVar7 != uVar6);
      }
      puVar9 = puVar9 + a_stride;
      puVar11 = puVar11 + b_stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar8);
    iVar10 = iVar10 + lVar5;
  }
  if (0xf < height) {
    iVar4 = 0;
    do {
      puVar9 = a;
      puVar11 = b;
      iVar8 = iVar1 >> 4;
      if (0xf < width) {
        do {
          iVar3 = (*aom_sse)(puVar9,a_stride,puVar11,b_stride,0x10,0x10);
          iVar10 = iVar10 + iVar3;
          iVar8 = iVar8 + -1;
          puVar9 = puVar9 + 0x10;
          puVar11 = puVar11 + 0x10;
        } while (iVar8 != 0);
      }
      a = a + (a_stride << 4);
      b = b + (b_stride << 4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar2 >> 4);
  }
  return iVar10;
}

Assistant:

static int64_t get_sse(const uint8_t *a, int a_stride, const uint8_t *b,
                       int b_stride, int width, int height) {
  const int dw = width % 16;
  const int dh = height % 16;
  int64_t total_sse = 0;
  int x, y;

  if (dw > 0) {
    total_sse += encoder_sse(&a[width - dw], a_stride, &b[width - dw], b_stride,
                             dw, height);
  }

  if (dh > 0) {
    total_sse +=
        encoder_sse(&a[(height - dh) * a_stride], a_stride,
                    &b[(height - dh) * b_stride], b_stride, width - dw, dh);
  }

  for (y = 0; y < height / 16; ++y) {
    const uint8_t *pa = a;
    const uint8_t *pb = b;
    for (x = 0; x < width / 16; ++x) {
      total_sse += aom_sse(pa, a_stride, pb, b_stride, 16, 16);

      pa += 16;
      pb += 16;
    }

    a += 16 * a_stride;
    b += 16 * b_stride;
  }

  return total_sse;
}